

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupAbsGates(Gia_Man_t *p,Vec_Int_t *vGateClasses)

{
  int iVar1;
  uint uVar2;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  long lVar8;
  Vec_Int_t *vFlops;
  Vec_Int_t *vNodes;
  Vec_Int_t *vPPis;
  Vec_Int_t *vPis;
  Vec_Int_t *local_38;
  
  if (p->vCos->nSize - p->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                  ,0xe2,"Gia_Man_t *Gia_ManDupAbsGates(Gia_Man_t *, Vec_Int_t *)");
  }
  if (vGateClasses->nSize != p->nObjs) {
    __assert_fail("Vec_IntSize(vGateClasses) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                  ,0xe3,"Gia_Man_t *Gia_ManDupAbsGates(Gia_Man_t *, Vec_Int_t *)");
  }
  local_38 = vGateClasses;
  Gia_ManGlaCollect(p,vGateClasses,&vPis,&vPPis,&vFlops,&vNodes);
  p_00 = Gia_ManStart(5000);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (iVar7 = 0; iVar7 < vPis->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(vPis,iVar7);
    pGVar4 = Gia_ManObj(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar4->Value = uVar2;
  }
  for (iVar7 = 0; iVar7 < vPPis->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(vPPis,iVar7);
    pGVar4 = Gia_ManObj(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar4->Value = uVar2;
  }
  for (iVar7 = 0; iVar7 < vFlops->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(vFlops,iVar7);
    pGVar4 = Gia_ManObj(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar4->Value = uVar2;
  }
  for (iVar7 = 0; iVar7 < vNodes->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(vNodes,iVar7);
    pGVar4 = Gia_ManObj(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjFanin0Copy(pGVar4);
    iLit1 = Gia_ObjFanin1Copy(pGVar4);
    uVar2 = Gia_ManAppendAnd(p_00,iVar1,iLit1);
    pGVar4->Value = uVar2;
  }
  for (iVar7 = 0; iVar7 < p->vCos->nSize - p->nRegs; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCo(p,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjFanin0Copy(pGVar4);
    uVar2 = Gia_ManAppendCo(p_00,iVar1);
    pGVar4->Value = uVar2;
  }
  iVar7 = 0;
  while( true ) {
    iVar1 = vFlops->nSize;
    if (iVar1 <= iVar7) break;
    iVar1 = Vec_IntEntry(vFlops,iVar7);
    pGVar4 = Gia_ManObj(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) {
      iVar1 = vFlops->nSize;
      break;
    }
    pGVar5 = Gia_ObjRoToRi(p,pGVar4);
    iVar1 = Gia_ObjFanin0Copy(pGVar5);
    uVar2 = Gia_ManAppendCo(p_00,iVar1);
    pGVar4 = Gia_ObjRoToRi(p,pGVar4);
    pGVar4->Value = uVar2;
    iVar7 = iVar7 + 1;
  }
  Gia_ManSetRegNum(p_00,iVar1);
  pGVar6 = Gia_ManSeqCleanup(p_00);
  if (p_00->nObjs != pGVar6->nObjs) {
    for (lVar8 = 0; lVar8 < p->nObjs; lVar8 = lVar8 + 1) {
      pGVar4 = Gia_ManObj(p,(int)lVar8);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if (pGVar4->Value != 0xffffffff) {
        iVar7 = Abc_LitIsCompl(pGVar4->Value);
        if (iVar7 != 0) {
          __assert_fail("!Abc_LitIsCompl(pObj->Value)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                        ,0x10d,"Gia_Man_t *Gia_ManDupAbsGates(Gia_Man_t *, Vec_Int_t *)");
        }
        iVar7 = Abc_Lit2Var(pGVar4->Value);
        pGVar5 = Gia_ManObj(p_00,iVar7);
        if (pGVar5->Value == 0xffffffff) {
          if (local_38->nSize <= lVar8) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          local_38->pArray[lVar8] = 0;
          uVar2 = 0xffffffff;
        }
        else {
          iVar7 = Abc_LitIsCompl(pGVar5->Value);
          if (iVar7 != 0) {
            __assert_fail("!Abc_LitIsCompl(pCopy->Value)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                          ,0x115,"Gia_Man_t *Gia_ManDupAbsGates(Gia_Man_t *, Vec_Int_t *)");
          }
          uVar2 = pGVar5->Value;
        }
        pGVar4->Value = uVar2;
      }
    }
  }
  Gia_ManStop(p_00);
  Vec_IntFree(vPis);
  Vec_IntFree(vPPis);
  Vec_IntFree(vFlops);
  Vec_IntFree(vNodes);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManDupAbsGates( Gia_Man_t * p, Vec_Int_t * vGateClasses )
{ 
    Vec_Int_t * vPis, * vPPis, * vFlops, * vNodes;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pCopy;
    int i;//, nFlops = 0;
    assert( Gia_ManPoNum(p) == 1 );
    assert( Vec_IntSize(vGateClasses) == Gia_ManObjNum(p) );

    // create additional arrays
    Gia_ManGlaCollect( p, vGateClasses, &vPis, &vPPis, &vFlops, &vNodes );

    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create constant
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    Gia_ManForEachObjVec( vPis, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create additional PIs
    Gia_ManForEachObjVec( vPPis, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create ROs
    Gia_ManForEachObjVec( vFlops, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create internal nodes
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
//        Gia_ManDupAbsGates_rec( pNew, pObj );
    // create PO
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // create RIs
    Gia_ManForEachObjVec( vFlops, p, pObj, i )
        Gia_ObjRoToRi(p, pObj)->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ObjRoToRi(p, pObj)) );
    Gia_ManSetRegNum( pNew, Vec_IntSize(vFlops) );
    // clean up
    pNew = Gia_ManSeqCleanup( pTemp = pNew );
    // transfer copy values: (p -> pTemp -> pNew) => (p -> pNew)
    if ( Gia_ManObjNum(pTemp) != Gia_ManObjNum(pNew) )
    {
//        printf( "Gia_ManDupAbsGates() Internal error: object mismatch.\n" );
        Gia_ManForEachObj( p, pObj, i )
        {
            if ( !~pObj->Value )
                continue;
            assert( !Abc_LitIsCompl(pObj->Value) );
            pCopy = Gia_ObjCopy( pTemp, pObj );
            if ( !~pCopy->Value )
            {
                Vec_IntWriteEntry( vGateClasses, i, 0 );
                pObj->Value = ~0;
                continue;
            }
            assert( !Abc_LitIsCompl(pCopy->Value) );
            pObj->Value = pCopy->Value;
        }
    }
    Gia_ManStop( pTemp );

    Vec_IntFree( vPis );
    Vec_IntFree( vPPis );
    Vec_IntFree( vFlops );
    Vec_IntFree( vNodes );
    return pNew;
}